

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dti.cpp
# Opt level: O1

bool ReadDTI(MemFile *file,shared_ptr<Disk> *disk)

{
  byte bVar1;
  element_type *peVar2;
  bool bVar3;
  int size_;
  ssize_t sVar4;
  byte *pv_;
  exception *peVar5;
  size_t in_RCX;
  size_t __nbytes;
  uint head_;
  uint cyl_;
  DTI_HEADER dh;
  int uDataLen;
  int uBlock;
  CylHead cylhead;
  Data data;
  Track track;
  Sector sector;
  int local_dc;
  byte local_d8;
  byte local_d7;
  ushort local_d6;
  uint local_d4;
  uint local_d0;
  allocator_type local_c9;
  CylHead local_c8;
  shared_ptr<Disk> *local_c0;
  byte *local_b8;
  MemFile *local_b0;
  void *local_a8 [2];
  long local_98;
  Track local_90;
  Sector local_70;
  
  local_c0 = disk;
  MemFile::rewind(file,(FILE *)disk);
  local_b0 = file;
  sVar4 = MemFile::read(file,(int)&local_dc,(void *)0x8,in_RCX);
  if (((char)sVar4 == '\0') || (local_dc != 0x32473248)) {
    bVar3 = false;
  }
  else {
    __nbytes = 0x200;
    Format::Validate((uint)local_d8,(uint)local_d7,1,0x200,0);
    local_d0 = (uint)local_d6;
    if (local_d0 != 0x900) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[31],int&,char_const(&)[2]>
                (peVar5,(char (*) [31])"unsupported track block size (",(int *)&local_d0,
                 (char (*) [2])0x1aefa0);
      __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    pv_ = AllocMem((uint)local_d6);
    if (local_d7 != 0) {
      local_b8 = pv_ + 2;
      head_ = 0;
      do {
        if (local_d8 != 0) {
          cyl_ = 0;
          do {
            CylHead::CylHead(&local_c8,cyl_,head_);
            sVar4 = MemFile::read(local_b0,(int)pv_,(void *)(ulong)local_d0,__nbytes);
            if ((char)sVar4 == '\0') {
              peVar5 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[22],CylHead&>
                        (peVar5,(char (*) [22])"short file reading %s",&local_c8);
              __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar1 = *pv_;
            local_d4 = (uint)*(ushort *)(pv_ + 1);
            __nbytes = (size_t)(local_d0 - 3);
            if ((int)(local_d0 - 3) < (int)local_d4) {
              peVar5 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[22],int&,char_const(&)[6],CylHead&>
                        (peVar5,(char (*) [22])"invalid data length (",(int *)&local_d4,
                         (char (*) [6])") on ",&local_c8);
              __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            Track::Track(&local_90,1);
            if (local_d4 != 0) {
              size_ = SizeToCode(0x1000);
              Header::Header((Header *)local_a8,&local_c8,0,size_);
              Sector::Sector(&local_70,_250K,Ace,(Header *)local_a8,0);
              std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,local_b8,
                         local_b8 + (int)local_d4,&local_c9);
              __nbytes = 0xfb;
              Sector::add(&local_70,(Data *)local_a8,(bool)(bVar1 & 1),0xfb);
              Track::add(&local_90,&local_70);
              if (local_a8[0] != (void *)0x0) {
                operator_delete(local_a8[0],local_98 - (long)local_a8[0]);
              }
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_70.m_data);
            }
            Disk::write((local_c0->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                        (int)&local_c8,&local_90,__nbytes);
            std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_90.m_sectors);
            cyl_ = cyl_ + 1;
          } while (cyl_ < local_d8);
        }
        head_ = head_ + 1;
      } while (head_ < local_d7);
    }
    peVar2 = (local_c0->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b0cce);
    FreeMem(pv_);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ReadDTI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    DTI_HEADER dh;
    if (!file.read(&dh, sizeof(dh)) || memcmp(dh.abSignature, DTI_SIGNATURE, sizeof(dh.abSignature)))
        return false;

    Format::Validate(dh.bTracks, dh.bSides);

    auto uBlock = (dh.bBlockHigh << 8) | dh.bBlockLow;
    if (uBlock != DTI_BLOCK_SIZE)
        throw util::exception("unsupported track block size (", uBlock, ")");

    MEMORY mem(uBlock);

    for (uint8_t head = 0; head < dh.bSides; head++)
    {
        for (uint8_t cyl = 0; cyl < dh.bTracks; cyl++)
        {
            CylHead cylhead(cyl, head);

            if (!file.read(mem, uBlock))
                throw util::exception("short file reading %s", cylhead);

            uint8_t flags = mem[0];
            auto uDataLen = (mem[2] << 8) | mem[1];
            if (uDataLen > uBlock - static_cast<int>(sizeof(DTI_TRACK)))
                throw util::exception("invalid data length (", uDataLen, ") on ", cylhead);

            Track track(1);
            if (uDataLen)
            {
                bool bad_data_crc = (flags & 1) != 0;
                Sector sector(DataRate::_250K, Encoding::Ace, Header(cylhead, 0, SizeToCode(4096)));
                Data data(mem.pb + 2, mem.pb + 2 + uDataLen);
                sector.add(std::move(data), bad_data_crc);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    disk->strType = "DTI";
    return true;
}